

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

Type * __thiscall
soul::AST::EndpointDetails::getDataType
          (Type *__return_storage_ptr__,EndpointDetails *this,Expression *e)

{
  bool bVar1;
  int iVar2;
  Primitive PVar3;
  pointer other;
  Structure *pSVar4;
  undefined4 uVar5;
  pointer pTVar6;
  bool bVar7;
  undefined8 local_90;
  Structure *local_80;
  undefined8 local_78;
  undefined4 local_70;
  vector<soul::Type,_std::allocator<soul::Type>_> local_68;
  EndpointDetails *local_50;
  Type local_48;
  
  local_50 = this;
  getSampleArrayTypes(&local_68,this);
  pTVar6 = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5._0_1_ = __return_storage_ptr__->category;
  uVar5._1_1_ = __return_storage_ptr__->arrayElementCategory;
  uVar5._2_1_ = __return_storage_ptr__->isRef;
  uVar5._3_1_ = __return_storage_ptr__->isConstant;
  bVar7 = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (!bVar7) {
    local_90._0_4_ = (__return_storage_ptr__->primitiveType).type;
    local_78._0_4_ = __return_storage_ptr__->boundingSize;
    local_78._4_4_ = __return_storage_ptr__->arrayElementBoundingSize;
    local_80 = (__return_storage_ptr__->structure).object;
    other = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_start;
    do {
      (*(e->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_48,e);
      bVar1 = Type::isEqual(&local_48,other,4);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
      if (bVar1) {
        uVar5._0_1_ = other->category;
        uVar5._1_1_ = other->arrayElementCategory;
        uVar5._2_1_ = other->isRef;
        uVar5._3_1_ = other->isConstant;
        local_90._0_4_ = (other->primitiveType).type;
        local_78._0_4_ = other->boundingSize;
        local_78._4_4_ = other->arrayElementBoundingSize;
        local_80 = (other->structure).object;
        if (local_80 != (Structure *)0x0) {
          (local_80->super_RefCountedObject).refCount =
               (local_80->super_RefCountedObject).refCount + 1;
        }
        if (bVar1) {
          (__return_storage_ptr__->primitiveType).type = (Primitive)local_90;
          __return_storage_ptr__->boundingSize = (undefined4)local_78;
          __return_storage_ptr__->arrayElementBoundingSize = local_78._4_4_;
          (__return_storage_ptr__->structure).object = local_80;
          __return_storage_ptr__->category = (undefined1)uVar5;
          __return_storage_ptr__->arrayElementCategory = uVar5._1_1_;
          __return_storage_ptr__->isRef = (bool)uVar5._2_1_;
          __return_storage_ptr__->isConstant = (bool)uVar5._3_1_;
          std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
          if (!bVar7) {
            return __return_storage_ptr__;
          }
          goto LAB_0024944a;
        }
      }
      other = other + 1;
      bVar7 = other == pTVar6;
    } while (!bVar7);
    (__return_storage_ptr__->primitiveType).type = (Primitive)local_90;
    __return_storage_ptr__->boundingSize = (undefined4)local_78;
    __return_storage_ptr__->arrayElementBoundingSize = local_78._4_4_;
    (__return_storage_ptr__->structure).object = local_80;
  }
  __return_storage_ptr__->category = (char)uVar5;
  __return_storage_ptr__->arrayElementCategory = (char)((uint)uVar5 >> 8);
  __return_storage_ptr__->isRef = (bool)(char)((uint)uVar5 >> 0x10);
  __return_storage_ptr__->isConstant = (bool)(char)((uint)uVar5 >> 0x18);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
LAB_0024944a:
  getSampleArrayTypes(&local_68,local_50);
  local_70._0_1_ = __return_storage_ptr__->category;
  local_70._1_1_ = __return_storage_ptr__->arrayElementCategory;
  local_70._2_1_ = __return_storage_ptr__->isRef;
  local_70._3_1_ = __return_storage_ptr__->isConstant;
  bVar7 = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (!bVar7) {
    PVar3 = (__return_storage_ptr__->primitiveType).type;
    local_90._0_4_ = __return_storage_ptr__->boundingSize;
    local_90._4_4_ = __return_storage_ptr__->arrayElementBoundingSize;
    pSVar4 = (__return_storage_ptr__->structure).object;
    pTVar6 = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar2 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(e,pTVar6);
      if ((char)iVar2 != '\0') {
        local_70._0_1_ = pTVar6->category;
        local_70._1_1_ = pTVar6->arrayElementCategory;
        local_70._2_1_ = pTVar6->isRef;
        local_70._3_1_ = pTVar6->isConstant;
        PVar3 = (pTVar6->primitiveType).type;
        local_90._0_4_ = pTVar6->boundingSize;
        local_90._4_4_ = pTVar6->arrayElementBoundingSize;
        pSVar4 = (pTVar6->structure).object;
        if (pSVar4 != (Structure *)0x0) {
          (pSVar4->super_RefCountedObject).refCount = (pSVar4->super_RefCountedObject).refCount + 1;
        }
        if ((char)iVar2 != '\0') {
          (__return_storage_ptr__->primitiveType).type = PVar3;
          __return_storage_ptr__->boundingSize = (Primitive)local_90;
          __return_storage_ptr__->arrayElementBoundingSize = local_90._4_4_;
          (__return_storage_ptr__->structure).object = pSVar4;
          __return_storage_ptr__->category = (undefined1)local_70;
          __return_storage_ptr__->arrayElementCategory = local_70._1_1_;
          __return_storage_ptr__->isRef = (bool)local_70._2_1_;
          __return_storage_ptr__->isConstant = (bool)local_70._3_1_;
          std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
          if (!bVar7) {
            return __return_storage_ptr__;
          }
          goto LAB_002494f6;
        }
      }
      pTVar6 = pTVar6 + 1;
      bVar7 = pTVar6 == local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl
                        .super__Vector_impl_data._M_finish;
    } while (!bVar7);
    (__return_storage_ptr__->primitiveType).type = PVar3;
    __return_storage_ptr__->boundingSize = (Primitive)local_90;
    __return_storage_ptr__->arrayElementBoundingSize = local_90._4_4_;
    (__return_storage_ptr__->structure).object = pSVar4;
  }
  __return_storage_ptr__->category = (undefined1)local_70;
  __return_storage_ptr__->arrayElementCategory = local_70._1_1_;
  __return_storage_ptr__->isRef = (bool)local_70._2_1_;
  __return_storage_ptr__->isConstant = (bool)local_70._3_1_;
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
LAB_002494f6:
  throwInternalCompilerError("getDataType",0x414);
}

Assistant:

Type getDataType (Expression& e) const
        {
            for (auto& type : getSampleArrayTypes())
                if (e.getResultType().isEqual (type, Type::ignoreVectorSize1))
                    return type;

            for (auto& type : getSampleArrayTypes())
                if (e.canSilentlyCastTo (type))
                    return type;

            SOUL_ASSERT_FALSE;
            return {};
        }